

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O2

int Bmc_LoadAddCnf(void *pMan,int iLit)

{
  Gia_Man_t *p;
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  uint uVar4;
  int Lits [3];
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  p = *(Gia_Man_t **)((long)pMan + 8);
  iVar1 = Vec_IntEntry(*(Vec_Int_t **)((long)pMan + 0x18),(uint)iLit >> 1);
  pObj = Gia_ManObj(p,iVar1);
  *(int *)((long)pMan + 0x20) = *(int *)((long)pMan + 0x20) + 1;
  uVar3 = ~*(ulong *)pObj;
  iVar1 = 0;
  if ((uVar3 & 0x1fffffff1fffffff) != 0 && (uVar3 & 0x9fffffff) != 0) {
    uVar4 = (uint)*(ulong *)pObj;
    if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcLoad.c"
                    ,0x4f,"int Bmc_LoadAddCnf(void *, int)");
    }
    iVar1 = Abc_LitIsCompl(iLit);
    if (iVar1 == 0) {
      if (((uint)*(ulong *)pObj >> 0x1e & 1) != 0) {
        return 0;
      }
    }
    else if ((*(ulong *)pObj >> 0x3e & 1) != 0) {
      return 0;
    }
    Lits[0] = iLit ^ 1;
    iVar1 = Abc_LitIsCompl(iLit);
    iVar2 = Gia_ObjFaninId0p(*(Gia_Man_t **)((long)pMan + 8),pObj);
    iVar2 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,iVar2);
    uVar4 = *(uint *)pObj >> 0x1d & 1;
    if (iVar1 == 0) {
      Lits[1] = Abc_Var2Lit(iVar2,uVar4);
      sat_solver_clause_new(*(sat_solver **)((long)pMan + 0x10),Lits,Lits + 2,0);
      iVar1 = Gia_ObjFaninId1p(*(Gia_Man_t **)((long)pMan + 8),pObj);
      iVar1 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,iVar1);
      Lits[1] = Abc_Var2Lit(iVar1,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
      sat_solver_clause_new(*(sat_solver **)((long)pMan + 0x10),Lits,Lits + 2,0);
      uVar3 = 0x40000000;
    }
    else {
      uVar3 = 0x4000000000000000;
      Lits[1] = Abc_Var2Lit(iVar2,uVar4 ^ 1);
      iVar1 = Gia_ObjFaninId1p(*(Gia_Man_t **)((long)pMan + 8),pObj);
      iVar1 = Bmc_LoadGetSatVar((Bmc_Load_t *)pMan,iVar1);
      Lits[2] = Abc_Var2Lit(iVar1,(uint)((*(ulong *)pObj >> 0x3d & 1) == 0));
      sat_solver_clause_new
                (*(sat_solver **)((long)pMan + 0x10),Lits,(lit *)&stack0xffffffffffffffd8,0);
    }
    *(ulong *)pObj = *(ulong *)pObj | uVar3;
    *(int *)((long)pMan + 0x24) = *(int *)((long)pMan + 0x24) + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Bmc_LoadAddCnf( void * pMan, int iLit )
{
    Bmc_Load_t * p = (Bmc_Load_t *)pMan;
    int Lits[3], iVar = Abc_Lit2Var(iLit);
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, Vec_IntEntry(p->vSat2Id, iVar) );
    p->nCallBacks1++;
    if ( Gia_ObjIsCi(pObj) || Gia_ObjIsConst0(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    if ( (Abc_LitIsCompl(iLit) ? pObj->fMark1 : pObj->fMark0) )
        return 0;
    Lits[0] = Abc_LitNot(iLit);
    if ( Abc_LitIsCompl(iLit) )
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), !Gia_ObjFaninC0(pObj) );
        Lits[2] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), !Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 3, 0 );
        pObj->fMark1 = 1;
    }
    else
    {
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId0p(p->pGia, pObj)), Gia_ObjFaninC0(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        Lits[1] = Abc_Var2Lit( Bmc_LoadGetSatVar(p, Gia_ObjFaninId1p(p->pGia, pObj)), Gia_ObjFaninC1(pObj) );
        sat_solver_clause_new( p->pSat, Lits, Lits + 2, 0 );
        pObj->fMark0 = 1;
    }
    p->nCallBacks2++;
    return 1;
}